

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper * __thiscall
Js::JavascriptLibrary::CreateAlreadyDefinedWrapper_TTD(JavascriptLibrary *this,bool alreadyDefined)

{
  Recycler *alloc;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])
             &JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x1601;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_38);
  pJVar1 = (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
           new<Memory::Recycler>(1,alloc,0x572640);
  pJVar1->alreadyResolved = alreadyDefined;
  return pJVar1;
}

Assistant:

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* JavascriptLibrary::CreateAlreadyDefinedWrapper_TTD(bool alreadyDefined)
    {
        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyResolvedRecord->alreadyResolved = alreadyDefined;

        return alreadyResolvedRecord;
    }